

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_MacProjector.cpp
# Opt level: O0

void __thiscall Hydro::MacProjector::project(MacProjector *this,Real reltol,Real atol)

{
  value_type pMVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  Long LVar5;
  int *piVar6;
  reference ppMVar7;
  reference ppMVar8;
  pointer pMVar9;
  pointer dst;
  long in_RDI;
  int idim_2;
  int ilev_2;
  char *in_stack_000000a8;
  int in_stack_000000b4;
  char *in_stack_000000b8;
  char *in_stack_000000c0;
  int idim_1;
  int idim;
  Array<const_MultiFab_*,_3> u;
  int ilev_1;
  int ilev;
  int nlevs;
  MultiFab *in_stack_000001c8;
  bool in_stack_000001d7;
  Geometry *in_stack_000001d8;
  Array<const_MultiFab_*,_3> *in_stack_000001e0;
  MultiFab *in_stack_000001e8;
  char *in_stack_00000218;
  Real in_stack_00000220;
  Real in_stack_00000228;
  Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *in_stack_00000230;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *in_stack_00000238;
  MLMG *in_stack_00000240;
  Real in_stack_00000690;
  Array<MultiFab_*,_3> *in_stack_00000698;
  undefined1 in_stack_00000797;
  Geometry *in_stack_00000798;
  Array<const_MultiFab_*,_3> *in_stack_000007a0;
  MultiFab *in_stack_000007a8;
  value_type in_stack_fffffffffffffe88;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffffe90;
  MultiFab *in_stack_fffffffffffffe98;
  undefined8 in_stack_fffffffffffffea0;
  Periodicity *in_stack_fffffffffffffea8;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffffeb0;
  Geometry *in_stack_fffffffffffffeb8;
  Geometry *in_stack_fffffffffffffec0;
  MultiFab *in_stack_fffffffffffffec8;
  MultiFab *in_stack_fffffffffffffed0;
  MultiFab *in_stack_fffffffffffffed8;
  MultiFab *in_stack_fffffffffffffee8;
  Geometry *in_stack_fffffffffffffef0;
  undefined7 in_stack_fffffffffffffef8;
  undefined1 in_stack_fffffffffffffeff;
  int local_e8;
  int local_e4;
  FabArray<amrex::FArrayBox> *in_stack_ffffffffffffff28;
  int local_68;
  int local_64;
  int local_44;
  int local_40;
  
  LVar5 = amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::size
                    ((Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)0x74d5aa);
  iVar3 = (int)LVar5;
  for (local_40 = 0; local_40 < iVar3; local_40 = local_40 + 1) {
    piVar6 = amrex::Vector<int,_std::allocator<int>_>::operator[]
                       ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe90,
                        (size_type)in_stack_fffffffffffffe88);
    if (*piVar6 != 0) {
      (**(code **)(**(long **)(in_RDI + 0x48) + 0x18))(*(long **)(in_RDI + 0x48),local_40,0,0,0);
      piVar6 = amrex::Vector<int,_std::allocator<int>_>::operator[]
                         ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe90,
                          (size_type)in_stack_fffffffffffffe88);
      *piVar6 = 0;
    }
  }
  amrex::
  Vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>::
  operator[]((Vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
              *)in_stack_fffffffffffffe90,(size_type)in_stack_fffffffffffffe88);
  ppMVar7 = std::array<amrex::MultiFab_*,_3UL>::operator[]
                      ((array<amrex::MultiFab_*,_3UL> *)in_stack_fffffffffffffe90,
                       (size_type)in_stack_fffffffffffffe88);
  if (*ppMVar7 != (value_type)0x0) {
    averageDownVelocity((MacProjector *)in_stack_ffffffffffffff28);
  }
  for (local_44 = 0; local_44 < iVar3; local_44 = local_44 + 1) {
    amrex::
    Vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
    ::operator[]((Vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
                  *)in_stack_fffffffffffffe90,(size_type)in_stack_fffffffffffffe88);
    ppMVar7 = std::array<amrex::MultiFab_*,_3UL>::operator[]
                        ((array<amrex::MultiFab_*,_3UL> *)in_stack_fffffffffffffe90,
                         (size_type)in_stack_fffffffffffffe88);
    if (*ppMVar7 != (value_type)0x0) {
      for (local_64 = 0; local_64 < 3; local_64 = local_64 + 1) {
        amrex::
        Vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
        ::operator[]((Vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
                      *)in_stack_fffffffffffffe90,(size_type)in_stack_fffffffffffffe88);
        ppMVar7 = std::array<amrex::MultiFab_*,_3UL>::operator[]
                            ((array<amrex::MultiFab_*,_3UL> *)in_stack_fffffffffffffe90,
                             (size_type)in_stack_fffffffffffffe88);
        pMVar1 = *ppMVar7;
        ppMVar8 = std::array<const_amrex::MultiFab_*,_3UL>::operator[]
                            ((array<const_amrex::MultiFab_*,_3UL> *)in_stack_fffffffffffffe90,
                             (size_type)in_stack_fffffffffffffe88);
        *ppMVar8 = pMVar1;
      }
      if (*(int *)(in_RDI + 0x110) != 1) {
        for (local_68 = 0; local_68 < 3; local_68 = local_68 + 1) {
          amrex::
          Vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
          ::operator[]((Vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
                        *)in_stack_fffffffffffffe90,(size_type)in_stack_fffffffffffffe88);
          ppMVar7 = std::array<amrex::MultiFab_*,_3UL>::operator[]
                              ((array<amrex::MultiFab_*,_3UL> *)in_stack_fffffffffffffe90,
                               (size_type)in_stack_fffffffffffffe88);
          iVar4 = amrex::FabArrayBase::nGrow((FabArrayBase *)*ppMVar7,0);
          if (iVar4 < 1) {
            amrex::Assert_host(in_stack_000000c0,in_stack_000000b8,in_stack_000000b4,
                               in_stack_000000a8);
          }
          amrex::
          Vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
          ::operator[]((Vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
                        *)in_stack_fffffffffffffe90,(size_type)in_stack_fffffffffffffe88);
          std::array<amrex::MultiFab_*,_3UL>::operator[]
                    ((array<amrex::MultiFab_*,_3UL> *)in_stack_fffffffffffffe90,
                     (size_type)in_stack_fffffffffffffe88);
          amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
                    ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
                     in_stack_fffffffffffffe90,(size_type)in_stack_fffffffffffffe88);
          amrex::Geometry::periodicity(in_stack_fffffffffffffec0);
          amrex::FabArray<amrex::FArrayBox>::FillBoundary<double>
                    (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                     SUB81((ulong)in_stack_fffffffffffffea0 >> 0x38,0));
        }
      }
      amrex::
      Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
      ::operator[]((Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                    *)in_stack_fffffffffffffe90,(size_type)in_stack_fffffffffffffe88);
      bVar2 = std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                         0x74d8df);
      if (bVar2) {
        in_stack_fffffffffffffee8 =
             amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::operator[]
                       ((Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)
                        in_stack_fffffffffffffe90,(size_type)in_stack_fffffffffffffe88);
        in_stack_fffffffffffffef0 =
             amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
                       ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
                        in_stack_fffffffffffffe90,(size_type)in_stack_fffffffffffffe88);
        in_stack_fffffffffffffeff = *(int *)(in_RDI + 0x110) == 1;
        amrex::
        Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
        ::operator[]((Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                      *)in_stack_fffffffffffffe90,(size_type)in_stack_fffffffffffffe88);
        std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator*
                  ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                   in_stack_fffffffffffffe90);
        amrex::EB_computeDivergence
                  (in_stack_000001e8,in_stack_000001e0,in_stack_000001d8,in_stack_000001d7,
                   in_stack_000001c8);
      }
      else {
        amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::operator[]
                  ((Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)
                   in_stack_fffffffffffffe90,(size_type)in_stack_fffffffffffffe88);
        amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
                  ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
                   in_stack_fffffffffffffe90,(size_type)in_stack_fffffffffffffe88);
        amrex::EB_computeDivergence
                  (in_stack_000007a8,in_stack_000007a0,in_stack_00000798,(bool)in_stack_00000797);
      }
      in_stack_fffffffffffffed8 =
           amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::operator[]
                     ((Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)
                      in_stack_fffffffffffffe90,(size_type)in_stack_fffffffffffffe88);
      bVar2 = std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr<amrex::MLPoisson,_std::default_delete<amrex::MLPoisson>_> *)
                         0x74da0e);
      if (bVar2) {
        in_stack_fffffffffffffed0 = (MultiFab *)(1.0 / *(double *)(in_RDI + 0x50));
      }
      else {
        in_stack_fffffffffffffed0 = (MultiFab *)0xbff0000000000000;
      }
      amrex::MultiFab::mult((MultiFab *)in_stack_fffffffffffffe90,(Real)in_stack_fffffffffffffe88,0)
      ;
    }
    amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::operator[]
              ((Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)
               in_stack_fffffffffffffe90,(size_type)in_stack_fffffffffffffe88);
    bVar2 = amrex::FabArray<amrex::FArrayBox>::ok(in_stack_ffffffffffffff28);
    if (bVar2) {
      in_stack_fffffffffffffec8 =
           amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::operator[]
                     ((Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)
                      in_stack_fffffffffffffe90,(size_type)in_stack_fffffffffffffe88);
      bVar2 = std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr<amrex::MLPoisson,_std::default_delete<amrex::MLPoisson>_> *)
                         0x74daab);
      if (bVar2) {
        in_stack_fffffffffffffeb8 = (Geometry *)(-1.0 / *(double *)(in_RDI + 0x50));
      }
      else {
        in_stack_fffffffffffffeb8 = (Geometry *)&DAT_3ff0000000000000;
      }
      in_stack_fffffffffffffec0 = in_stack_fffffffffffffeb8;
      amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::operator[]
                ((Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)
                 in_stack_fffffffffffffe90,(size_type)in_stack_fffffffffffffe88);
      amrex::MultiFab::Saxpy
                (in_stack_fffffffffffffed0,(Real)in_stack_fffffffffffffec8,
                 (MultiFab *)in_stack_fffffffffffffec0,
                 (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20),(int)in_stack_fffffffffffffeb8,
                 (int)((ulong)in_stack_fffffffffffffeb0 >> 0x20),(int)in_stack_fffffffffffffeb0);
    }
    amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::operator[]
              ((Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)
               in_stack_fffffffffffffe90,(size_type)in_stack_fffffffffffffe88);
    amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              (in_stack_fffffffffffffe90,(value_type)in_stack_fffffffffffffe88);
  }
  pMVar9 = std::unique_ptr<amrex::MLMG,_std::default_delete<amrex::MLMG>_>::operator->
                     ((unique_ptr<amrex::MLMG,_std::default_delete<amrex::MLMG>_> *)0x74db76);
  amrex::GetVecOfPtrs<amrex::MultiFab,amrex::FabArray<amrex::FArrayBox>::FABType>
            ((Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)in_stack_fffffffffffffed8)
  ;
  amrex::GetVecOfConstPtrs<amrex::MultiFab,amrex::FabArray<amrex::FArrayBox>::FABType>
            ((Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)in_stack_fffffffffffffed8)
  ;
  amrex::MLMG::solve(in_stack_00000240,in_stack_00000238,in_stack_00000230,in_stack_00000228,
                     in_stack_00000220,in_stack_00000218);
  amrex::Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::~Vector
            ((Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)0x74dbf1);
  amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~Vector
            ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)0x74dbfe);
  amrex::
  Vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>::
  operator[]((Vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
              *)in_stack_fffffffffffffe90,(size_type)in_stack_fffffffffffffe88);
  ppMVar7 = std::array<amrex::MultiFab_*,_3UL>::operator[]
                      ((array<amrex::MultiFab_*,_3UL> *)in_stack_fffffffffffffe90,
                       (size_type)in_stack_fffffffffffffe88);
  if (*ppMVar7 != (value_type)0x0) {
    dst = std::unique_ptr<amrex::MLMG,_std::default_delete<amrex::MLMG>_>::operator->
                    ((unique_ptr<amrex::MLMG,_std::default_delete<amrex::MLMG>_> *)0x74dc3a);
    amrex::GetVecOfArrOfPtrs<amrex::MultiFab,_0>
              ((Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                *)in_stack_fffffffffffffee8);
    amrex::MLMG::getFluxes
              ((MLMG *)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8),
               (Vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
                *)in_stack_fffffffffffffef0,(Location)((ulong)in_stack_fffffffffffffee8 >> 0x20));
    amrex::
    Vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
    ::~Vector((Vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
               *)0x74dc8c);
    for (local_e4 = 0; local_e4 < iVar3; local_e4 = local_e4 + 1) {
      for (local_e8 = 0; local_e8 < 3; local_e8 = local_e8 + 1) {
        bVar2 = std::unique_ptr::operator_cast_to_bool
                          ((unique_ptr<amrex::MLPoisson,_std::default_delete<amrex::MLPoisson>_> *)
                           0x74dcd1);
        if (bVar2) {
          amrex::
          Vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
          ::operator[]((Vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
                        *)in_stack_fffffffffffffe90,(size_type)in_stack_fffffffffffffe88);
          ppMVar7 = std::array<amrex::MultiFab_*,_3UL>::operator[]
                              ((array<amrex::MultiFab_*,_3UL> *)in_stack_fffffffffffffe90,
                               (size_type)in_stack_fffffffffffffe88);
          in_stack_fffffffffffffe90 = &(*ppMVar7)->super_FabArray<amrex::FArrayBox>;
          in_stack_fffffffffffffe98 = *(MultiFab **)(in_RDI + 0x50);
          amrex::
          Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
          ::operator[]((Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                        *)in_stack_fffffffffffffe90,(size_type)in_stack_fffffffffffffe88);
          std::array<amrex::MultiFab,_3UL>::operator[]
                    ((array<amrex::MultiFab,_3UL> *)in_stack_fffffffffffffe90,
                     (size_type)in_stack_fffffffffffffe88);
          amrex::MultiFab::Saxpy
                    (in_stack_fffffffffffffed0,(Real)in_stack_fffffffffffffec8,
                     (MultiFab *)in_stack_fffffffffffffec0,
                     (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20),(int)in_stack_fffffffffffffeb8,
                     (int)((ulong)pMVar9 >> 0x20),(int)pMVar9);
        }
        else {
          amrex::
          Vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
          ::operator[]((Vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
                        *)in_stack_fffffffffffffe90,(size_type)in_stack_fffffffffffffe88);
          ppMVar7 = std::array<amrex::MultiFab_*,_3UL>::operator[]
                              ((array<amrex::MultiFab_*,_3UL> *)in_stack_fffffffffffffe90,
                               (size_type)in_stack_fffffffffffffe88);
          in_stack_fffffffffffffe88 = *ppMVar7;
          amrex::
          Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
          ::operator[]((Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                        *)in_stack_fffffffffffffe90,(size_type)in_stack_fffffffffffffe88);
          std::array<amrex::MultiFab,_3UL>::operator[]
                    ((array<amrex::MultiFab,_3UL> *)in_stack_fffffffffffffe90,
                     (size_type)in_stack_fffffffffffffe88);
          amrex::MultiFab::Add
                    ((MultiFab *)dst,in_stack_fffffffffffffe98,
                     (int)((ulong)in_stack_fffffffffffffe90 >> 0x20),(int)in_stack_fffffffffffffe90,
                     (int)((ulong)in_stack_fffffffffffffe88 >> 0x20),(int)in_stack_fffffffffffffe88)
          ;
        }
        amrex::
        Vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
        ::operator[]((Vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
                      *)in_stack_fffffffffffffe90,(size_type)in_stack_fffffffffffffe88);
        amrex::EB_set_covered_faces(in_stack_00000698,in_stack_00000690);
      }
    }
    averageDownVelocity((MacProjector *)in_stack_ffffffffffffff28);
  }
  return;
}

Assistant:

void
MacProjector::project (Real reltol, Real atol)
{
    const int nlevs = m_rhs.size();

    for (int ilev = 0; ilev < nlevs; ++ilev) {
        if (m_needs_level_bcs[ilev]) {
            m_linop->setLevelBC(ilev, nullptr);
            m_needs_level_bcs[ilev] = false;
        }
    }

    if ( m_umac[0][0] )
      averageDownVelocity();

    for (int ilev = 0; ilev < nlevs; ++ilev)
    {
      if ( m_umac[0][0] )
      {
        Array<MultiFab const*, AMREX_SPACEDIM> u;
        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
            u[idim] = m_umac[ilev][idim];
        }
#ifdef AMREX_USE_EB
        if (m_umac_loc != MLMG::Location::FaceCentroid)
        {
            for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
                AMREX_ALWAYS_ASSERT_WITH_MESSAGE(m_umac[ilev][idim]->nGrow() > 0,
                                                 "MacProjector: with EB, umac must have at least one ghost cell if not already_on_centroid");
                m_umac[ilev][idim]->FillBoundary(m_geom[ilev].periodicity());
            }
        }

        if (m_eb_vel[ilev]) {
           EB_computeDivergence(m_rhs[ilev], u, m_geom[ilev], (m_umac_loc == MLMG::Location::FaceCentroid), *m_eb_vel[ilev]);
        } else {
           EB_computeDivergence(m_rhs[ilev], u, m_geom[ilev], (m_umac_loc == MLMG::Location::FaceCentroid));
        }
#else
        computeDivergence(m_rhs[ilev], u, m_geom[ilev]);
#endif

        // For mlabeclaplacian, we solve -del dot (beta grad phi) = rhs
        //   and set up RHS as (m_divu - divu), where m_divu is a user-provided source term
        // For mlpoisson, we solve `del dot grad phi = rhs/(-const_beta)`
        //   and set up RHS as (m_divu - divu)*(-1/const_beta)
        AMREX_ASSERT(m_poisson == nullptr || m_const_beta != Real(0.0));
        m_rhs[ilev].mult(m_poisson ? Real(1.0)/m_const_beta : Real(-1.0));
      }
      //else m_rhs already initialized to 0

      if (m_divu[ilev].ok())
      {
        MultiFab::Saxpy(m_rhs[ilev], m_poisson ? Real(-1.0)/m_const_beta : Real(1.0),
                        m_divu[ilev], 0, 0, 1, 0);
      }

      // Always reset initial phi to be zero. This is needed to handle the
      // situation where the MacProjector is being reused.
      m_phi[ilev].setVal(0.0);
    }

    m_mlmg->solve(amrex::GetVecOfPtrs(m_phi), amrex::GetVecOfConstPtrs(m_rhs), reltol, atol);

    if ( m_umac[0][0] )
    {
      m_mlmg->getFluxes(amrex::GetVecOfArrOfPtrs(m_fluxes), m_umac_loc);

      for (int ilev = 0; ilev < nlevs; ++ilev) {
        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
            if (m_poisson) {
                MultiFab::Saxpy(*m_umac[ilev][idim], m_const_beta, m_fluxes[ilev][idim], 0,0,1,0);
            } else {
                MultiFab::Add(*m_umac[ilev][idim], m_fluxes[ilev][idim], 0, 0, 1, 0);
            }
#ifdef AMREX_USE_EB
            EB_set_covered_faces(m_umac[ilev], 0.0);
#endif
        }
      }

      averageDownVelocity();
    }

}